

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWrite.cpp
# Opt level: O0

ssize_t __thiscall stk::FileWrite::write(FileWrite *this,int __fd,void *__buf,size_t __n)

{
  uint uVar1;
  FileWrite *extraout_RAX;
  FileWrite *extraout_RAX_00;
  StkFloat *pSVar2;
  size_t sVar3;
  ssize_t extraout_RAX_01;
  undefined4 in_register_00000034;
  uchar *ptr;
  unsigned_long k_6;
  uchar *puStack_80;
  SINT32 sample_6;
  unsigned_long k_5;
  FLOAT64 sample_5;
  unsigned_long k_4;
  uchar *puStack_60;
  FLOAT32 sample_4;
  unsigned_long k_3;
  uchar *puStack_50;
  SINT32 sample_3;
  unsigned_long k_2;
  uchar *puStack_40;
  char sample_2;
  unsigned_long k_1;
  uchar *puStack_30;
  uchar sample_1;
  unsigned_long k;
  uchar *puStack_20;
  SINT16 sample;
  unsigned_long nSamples;
  StkFrames *buffer_local;
  FileWrite *this_local;
  
  nSamples = CONCAT44(in_register_00000034,__fd);
  buffer_local = (StkFrames *)this;
  if (this->fd_ == (FILE *)0x0) {
    std::operator<<((ostream *)Stk::oStream__abi_cxx11_,
                    "FileWrite::write(): a file has not yet been opened!");
    Stk::handleError(&this->super_Stk,WARNING);
    this = extraout_RAX;
  }
  else {
    uVar1 = StkFrames::channels((StkFrames *)nSamples);
    if (uVar1 == this->channels_) {
      puStack_20 = (uchar *)StkFrames::size((StkFrames *)nSamples);
      if (this->dataType_ == 2) {
        for (puStack_30 = (uchar *)0x0; puStack_30 < puStack_20; puStack_30 = puStack_30 + 1) {
          pSVar2 = StkFrames::operator[]((StkFrames *)nSamples,(size_t)puStack_30);
          k._6_2_ = (undefined2)(int)(*pSVar2 * 32767.0);
          if ((this->byteswap_ & 1U) != 0) {
            Stk::swap16((uchar *)((long)&k + 6));
          }
          sVar3 = fwrite((void *)((long)&k + 6),2,1,(FILE *)this->fd_);
          if (sVar3 != 1) {
LAB_0011b6d6:
            std::operator<<((ostream *)Stk::oStream__abi_cxx11_,
                            "FileWrite::write(): error writing data to file!");
            Stk::handleError(&this->super_Stk,FILE_ERROR);
            return extraout_RAX_01;
          }
        }
      }
      else if (this->dataType_ == 1) {
        if (this->fileType_ == 2) {
          for (puStack_40 = (uchar *)0x0; puStack_40 < puStack_20; puStack_40 = puStack_40 + 1) {
            pSVar2 = StkFrames::operator[]((StkFrames *)nSamples,(size_t)puStack_40);
            k_1._7_1_ = (undefined1)(int)(*pSVar2 * 127.0 + 128.0);
            sVar3 = fwrite((void *)((long)&k_1 + 7),1,1,(FILE *)this->fd_);
            if (sVar3 != 1) goto LAB_0011b6d6;
          }
        }
        else {
          for (puStack_50 = (uchar *)0x0; puStack_50 < puStack_20; puStack_50 = puStack_50 + 1) {
            pSVar2 = StkFrames::operator[]((StkFrames *)nSamples,(size_t)puStack_50);
            k_2._7_1_ = (undefined1)(int)(*pSVar2 * 127.0);
            sVar3 = fwrite((void *)((long)&k_2 + 7),1,1,(FILE *)this->fd_);
            if (sVar3 != 1) goto LAB_0011b6d6;
          }
        }
      }
      else if (this->dataType_ == 8) {
        for (puStack_60 = (uchar *)0x0; puStack_60 < puStack_20; puStack_60 = puStack_60 + 1) {
          pSVar2 = StkFrames::operator[]((StkFrames *)nSamples,(size_t)puStack_60);
          k_3._4_4_ = (int)(*pSVar2 * 2147483647.0);
          if ((this->byteswap_ & 1U) != 0) {
            Stk::swap32((uchar *)((long)&k_3 + 4));
          }
          sVar3 = fwrite((void *)((long)&k_3 + 4),4,1,(FILE *)this->fd_);
          if (sVar3 != 1) goto LAB_0011b6d6;
        }
      }
      else if (this->dataType_ == 0x10) {
        for (sample_5 = 0.0; (ulong)sample_5 < puStack_20; sample_5 = (FLOAT64)((long)sample_5 + 1))
        {
          pSVar2 = StkFrames::operator[]((StkFrames *)nSamples,(size_t)sample_5);
          k_4._4_4_ = (float)*pSVar2;
          if ((this->byteswap_ & 1U) != 0) {
            Stk::swap32((uchar *)((long)&k_4 + 4));
          }
          sVar3 = fwrite((void *)((long)&k_4 + 4),4,1,(FILE *)this->fd_);
          if (sVar3 != 1) goto LAB_0011b6d6;
        }
      }
      else if (this->dataType_ == 0x20) {
        for (puStack_80 = (uchar *)0x0; puStack_80 < puStack_20; puStack_80 = puStack_80 + 1) {
          pSVar2 = StkFrames::operator[]((StkFrames *)nSamples,(size_t)puStack_80);
          k_5 = (unsigned_long)*pSVar2;
          if ((this->byteswap_ & 1U) != 0) {
            Stk::swap64((uchar *)&k_5);
          }
          sVar3 = fwrite(&k_5,8,1,(FILE *)this->fd_);
          if (sVar3 != 1) goto LAB_0011b6d6;
        }
      }
      else if (this->dataType_ == 4) {
        for (ptr = (uchar *)0x0; ptr < puStack_20; ptr = ptr + 1) {
          pSVar2 = StkFrames::operator[]((StkFrames *)nSamples,(size_t)ptr);
          k_6._4_4_ = (int)(*pSVar2 * 8388607.0);
          if ((this->byteswap_ & 1U) == 0) {
            sVar3 = fwrite((void *)((long)&k_6 + 4),3,1,(FILE *)this->fd_);
          }
          else {
            Stk::swap32((uchar *)((long)&k_6 + 4));
            sVar3 = fwrite((void *)((long)&k_6 + 5),3,1,(FILE *)this->fd_);
          }
          if (sVar3 != 1) goto LAB_0011b6d6;
        }
      }
      uVar1 = StkFrames::frames((StkFrames *)nSamples);
      this->frameCounter_ = (ulong)uVar1 + this->frameCounter_;
    }
    else {
      std::operator<<((ostream *)Stk::oStream__abi_cxx11_,
                      "FileWrite::write(): number of channels in the StkFrames argument does not match that specified to open() function!"
                     );
      Stk::handleError(&this->super_Stk,FUNCTION_ARGUMENT);
      this = extraout_RAX_00;
    }
  }
  return (ssize_t)this;
}

Assistant:

void FileWrite :: write( StkFrames& buffer )
{
  if ( fd_ == 0 ) {
    oStream_ << "FileWrite::write(): a file has not yet been opened!";
    handleError( StkError::WARNING );
    return;
  }

  if ( buffer.channels() != channels_ ) {
    oStream_ << "FileWrite::write(): number of channels in the StkFrames argument does not match that specified to open() function!";
    handleError( StkError::FUNCTION_ARGUMENT );
    return;
  }

  unsigned long nSamples = buffer.size();
  if ( dataType_ == STK_SINT16 ) {
    SINT16 sample;
    for ( unsigned long k=0; k<nSamples; k++ ) {
      sample = (SINT16) (buffer[k] * 32767.0);
      //sample = ((SINT16) (( buffer[k] + 1.0 ) * 32767.5 + 0.5)) - 32768;
      if ( byteswap_ ) swap16( (unsigned char *)&sample );
      if ( fwrite(&sample, 2, 1, fd_) != 1 ) goto error;
    }
  }
  else if ( dataType_ == STK_SINT8 ) {
    if ( fileType_ == FILE_WAV ) { // 8-bit WAV data is unsigned!
      unsigned char sample;
      for ( unsigned long k=0; k<nSamples; k++ ) {
        sample = (unsigned char) (buffer[k] * 127.0 + 128.0);
        if ( fwrite(&sample, 1, 1, fd_) != 1 ) goto error;
      }
    }
    else {
      signed char sample;
      for ( unsigned long k=0; k<nSamples; k++ ) {
        sample = (signed char) (buffer[k] * 127.0);
        //sample = ((signed char) (( buffer[k] + 1.0 ) * 127.5 + 0.5)) - 128;
        if ( fwrite(&sample, 1, 1, fd_) != 1 ) goto error;
      }
    }
  }
  else if ( dataType_ == STK_SINT32 ) {
    SINT32 sample;
    for ( unsigned long k=0; k<nSamples; k++ ) {
      sample = (SINT32) (buffer[k] * 2147483647.0);
      //sample = ((SINT32) (( buffer[k] + 1.0 ) * 2147483647.5 + 0.5)) - 2147483648;
      if ( byteswap_ ) swap32( (unsigned char *)&sample );
      if ( fwrite(&sample, 4, 1, fd_) != 1 ) goto error;
    }
  }
  else if ( dataType_ == STK_FLOAT32 ) {
    FLOAT32 sample;
    for ( unsigned long k=0; k<nSamples; k++ ) {
      sample = (FLOAT32) (buffer[k]);
      if ( byteswap_ ) swap32( (unsigned char *)&sample );
      if ( fwrite(&sample, 4, 1, fd_) != 1 ) goto error;
    }
  }
  else if ( dataType_ == STK_FLOAT64 ) {
    FLOAT64 sample;
    for ( unsigned long k=0; k<nSamples; k++ ) {
      sample = (FLOAT64) (buffer[k]);
      if ( byteswap_ ) swap64( (unsigned char *)&sample );
      if ( fwrite(&sample, 8, 1, fd_) != 1 ) goto error;
    }
  }
  else if ( dataType_ == STK_SINT24 ) {
    SINT32 sample;
    for ( unsigned long k=0; k<nSamples; k++ ) {
      sample = (SINT32) (buffer[k] * 8388607.0);
      if ( byteswap_ ) {
        swap32( (unsigned char *)&sample );
        unsigned char *ptr = (unsigned char *) &sample;
        if ( fwrite(ptr+1, 3, 1, fd_) != 1 ) goto error;
      }
      else
        if ( fwrite(&sample, 3, 1, fd_) != 1 ) goto error;
    }
  }

  frameCounter_ += buffer.frames();
  return;

 error:
  oStream_ << "FileWrite::write(): error writing data to file!";
  handleError( StkError::FILE_ERROR );
}